

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O1

glsl_type *
process_array_type(YYLTYPE *loc,glsl_type *base,ast_array_specifier *array_specifier,
                  _mesa_glsl_parse_state *state)

{
  exec_node *peVar1;
  exec_node *peVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  long *plVar6;
  long lVar7;
  uint uVar8;
  char *fmt;
  exec_node **ppeVar9;
  exec_list dummy_instructions;
  YYLTYPE locp;
  undefined8 *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 *puStack_60;
  YYLTYPE local_50;
  
  if (array_specifier != (ast_array_specifier *)0x0) {
    if ((base->field_0x4 != '\x11') ||
       (bVar3 = _mesa_glsl_parse_state::check_arrays_of_arrays_allowed(state,loc), bVar3)) {
      peVar1 = (array_specifier->array_dimensions).tail_sentinel.prev;
      peVar2 = peVar1->prev;
      while (peVar2 != (exec_node *)0x0) {
        local_78 = &local_68;
        uStack_70 = 0;
        local_68 = 0;
        uVar5 = 0;
        puStack_60 = (undefined1 *)&local_78;
        if (*(int *)&peVar1[1].next != 0x29) {
          ppeVar9 = &peVar1[-3].prev;
          puStack_60 = (undefined1 *)&local_78;
          plVar6 = (long *)(*(code *)(*ppeVar9)->prev)(ppeVar9,&local_78,state);
          local_50.path = (char *)peVar1[-2].next;
          local_50.source = *(uint *)&peVar1[-2].prev;
          local_50.first_line = *(int *)((long)&peVar1[-2].prev + 4);
          local_50.first_column = *(int *)&peVar1[-1].next;
          local_50.last_line = *(int *)((long)&peVar1[-1].next + 4);
          local_50.last_column = *(int *)&peVar1[-1].prev;
          if (plVar6 == (long *)0x0) {
            fmt = "array size could not be resolved";
          }
          else if ((*(byte *)(plVar6[4] + 4) & 0xfe) == 0) {
            if (*(char *)(plVar6[4] + 8) == '\x01') {
              lVar7 = (**(code **)(*plVar6 + 0x30))(plVar6,state,0);
              if (lVar7 != 0) {
                uVar5 = state->forced_language_version;
                if (uVar5 == 0) {
                  uVar5 = state->language_version;
                }
                uVar8 = 0x77;
                if (state->es_shader != false) {
                  uVar8 = 299;
                }
                if ((uVar5 <= uVar8) ||
                   (cVar4 = (*(code *)(*ppeVar9)[1].next)(ppeVar9), cVar4 == '\0')) {
                  uVar5 = *(uint *)(lVar7 + 0x28);
                  if (0 < (int)uVar5) {
                    if (*(long *)(lVar7 + 0x20) != plVar6[4]) {
                      __assert_fail("size->type == ir->type",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ast_to_hir.cpp"
                                    ,0x91d,
                                    "unsigned int process_array_size(exec_node *, struct _mesa_glsl_parse_state *)"
                                   );
                    }
                    if (local_78 != &local_68) {
                      __assert_fail("dummy_instructions.is_empty()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ast_to_hir.cpp"
                                    ,0x925,
                                    "unsigned int process_array_size(exec_node *, struct _mesa_glsl_parse_state *)"
                                   );
                    }
                    goto LAB_00194160;
                  }
                  fmt = "array size must be > 0";
                  goto LAB_00194154;
                }
              }
              fmt = "array size must be a constant valued expression";
            }
            else {
              fmt = "array size must be scalar type";
            }
          }
          else {
            fmt = "array size must be integer type";
          }
LAB_00194154:
          uVar5 = 0;
          _mesa_glsl_error(&local_50,state,fmt);
        }
LAB_00194160:
        base = glsl_type::get_array_instance(base,uVar5,0);
        peVar1 = peVar1->prev;
        peVar2 = peVar1->prev;
      }
    }
    else {
      base = &glsl_type::_error_type;
    }
  }
  return base;
}

Assistant:

static const glsl_type *
process_array_type(YYLTYPE *loc, const glsl_type *base,
                   ast_array_specifier *array_specifier,
                   struct _mesa_glsl_parse_state *state)
{
   const glsl_type *array_type = base;

   if (array_specifier != NULL) {
      if (base->is_array()) {

         /* From page 19 (page 25) of the GLSL 1.20 spec:
          *
          * "Only one-dimensional arrays may be declared."
          */
         if (!state->check_arrays_of_arrays_allowed(loc)) {
            return glsl_type::error_type;
         }
      }

      for (exec_node *node = array_specifier->array_dimensions.get_tail_raw();
           !node->is_head_sentinel(); node = node->prev) {
         unsigned array_size = process_array_size(node, state);
         array_type = glsl_type::get_array_instance(array_type, array_size);
      }
   }

   return array_type;
}